

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O3

void __thiscall
amrex::EB2::Level::fillEBCellFlag
          (Level *this,FabArray<amrex::EBCellFlagFab> *cellflag,Geometry *geom)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  EBCellFlagFab *this_00;
  element_type *peVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  FabType FVar17;
  ulong uVar18;
  pointer ppVar19;
  long lVar20;
  uint32_t *puVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  pointer pIVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  uint32_t *puVar31;
  Box *bx_in;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Periodicity PVar35;
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_f8;
  FabArray<amrex::EBCellFlagFab> *local_e0;
  BoxArray *local_d8;
  Box *local_d0;
  pointer local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  EBCellFlag *local_a0;
  pointer local_98;
  MFIter mfi;
  
  if (this->m_allregular == true) {
    FabArray<amrex::EBCellFlagFab>::setVal<amrex::EBCellFlagFab,_0>
              (cellflag,(value_type)0xffffffe4,0,(cellflag->super_FabArrayBase).n_comp,
               &(cellflag->super_FabArrayBase).n_grow);
    MFIter::MFIter(&mfi,&cellflag->super_FabArrayBase,'\0');
    if (mfi.currentIndex < mfi.endIndex) {
      do {
        iVar16 = mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar16 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[mfi.currentIndex];
        }
        *(undefined4 *)
         &((cellflag->m_fabs_v).
           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar16]->super_BaseFab<amrex::EBCellFlag>).
          field_0x44 = 0;
        MFIter::operator++(&mfi);
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
  }
  else {
    iVar16 = (cellflag->super_FabArrayBase).n_grow.vect[0];
    PVar35 = Geometry::periodicity(geom);
    local_f8.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_start = PVar35.period.vect._0_8_;
    local_f8.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = PVar35.period.vect[2];
    mfi._0_12_ = ZEXT812(0);
    r.smallend.vect[1] = iVar16;
    r.smallend.vect[0] = iVar16;
    r.smallend.vect[2] = iVar16;
    FabArray<amrex::EBCellFlagFab>::ParallelCopy_nowait
              (cellflag,&this->m_cellflag,0,0,1,(IntVect *)&mfi,&r.smallend,(Periodicity *)&local_f8
               ,COPY,(CPC *)0x0,false);
    mfi._0_12_ = Geometry::periodicity(geom);
    Periodicity::shiftIntVect(&local_f8,(Periodicity *)&mfi);
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    r.smallend.vect[0]._0_3_ = 0x10000;
    r.smallend.vect[2] = 0;
    r.bigend.vect[0] = 0;
    r.bigend.vect[1] = 0;
    r.smallend.vect[1] = -1;
    MFIter::MFIter(&mfi,&cellflag->super_FabArrayBase,(MFItInfo *)&r);
    if (mfi.currentIndex < mfi.endIndex) {
      local_d8 = &this->m_covered_grids;
      local_e0 = cellflag;
      do {
        iVar24 = mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar24 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[mfi.currentIndex];
        }
        this_00 = (local_e0->m_fabs_v).
                  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar24];
        bx_in = &(this_00->super_BaseFab<amrex::EBCellFlag>).domain;
        peVar8 = (this->m_covered_grids).m_ref.
                 super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (((peVar8->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start !=
             *(pointer *)
              ((long)&(peVar8->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data + 8)) &&
           (local_c8 = (pointer)CONCAT44(local_f8.
                                         super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                         (int)local_f8.
                                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                              ._M_impl.super__Vector_impl_data._M_finish),
           local_f8.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_start != local_c8)) {
          iVar24 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
          iVar1 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
          lVar20 = (long)(((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] -
                          iVar24) + 1);
          local_a0 = (this_00->super_BaseFab<amrex::EBCellFlag>).dptr + (3 - (long)iVar24);
          local_a8 = (long)iVar1 * -4;
          local_c0 = (long)(((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] -
                            iVar1) + 1) * 4;
          local_b0 = -(long)(this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
          lVar22 = local_c0 * lVar20;
          pIVar27 = local_f8.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_d0 = bx_in;
          local_b8 = lVar20;
          do {
            uVar10 = *(undefined8 *)(local_d0->smallend).vect;
            uVar11 = *(undefined8 *)((local_d0->smallend).vect + 2);
            uVar12 = *(undefined8 *)((local_d0->bigend).vect + 2);
            r.bigend.vect[1] = (int)((ulong)*(undefined8 *)(local_d0->bigend).vect >> 0x20);
            r.bigend.vect[2] = (int)uVar12;
            r.btype.itype = (uint)((ulong)uVar12 >> 0x20);
            r.smallend.vect[2] = (int)uVar11;
            r.bigend.vect[0] = (int)((ulong)uVar11 >> 0x20);
            r.smallend.vect[0] = (int)uVar10 + (int)*(undefined8 *)pIVar27->vect;
            r.smallend.vect[1] =
                 (int)((ulong)uVar10 >> 0x20) + (int)((ulong)*(undefined8 *)pIVar27->vect >> 0x20);
            r.smallend.vect[2] = r.smallend.vect[2] + pIVar27->vect[2];
            r.bigend.vect[0] = r.bigend.vect[0] + pIVar27->vect[0];
            r.bigend.vect[1] = r.bigend.vect[1] + pIVar27->vect[1];
            r.bigend.vect[2] = r.bigend.vect[2] + pIVar27->vect[2];
            BoxArray::intersections(local_d8,&r,&isects);
            auVar15 = _DAT_0065f0d0;
            auVar14 = _DAT_0065b9b0;
            auVar13 = _DAT_0065b9a0;
            local_98 = isects.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            for (ppVar19 = isects.
                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppVar19 !=
                isects.
                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar19 = ppVar19 + 1) {
              iVar24 = (ppVar19->second).smallend.vect[2];
              iVar1 = (ppVar19->second).bigend.vect[2];
              if (iVar24 <= iVar1) {
                iVar2 = (ppVar19->second).bigend.vect[1];
                iVar3 = pIVar27->vect[1];
                iVar4 = (ppVar19->second).bigend.vect[0];
                iVar23 = iVar4 - pIVar27->vect[0];
                iVar5 = (ppVar19->second).smallend.vect[0];
                iVar6 = (ppVar19->second).smallend.vect[1];
                iVar30 = iVar5 - pIVar27->vect[0];
                iVar7 = pIVar27->vect[2];
                lVar26 = (long)(iVar6 - iVar3);
                lVar29 = (long)(iVar24 - iVar7);
                if (iVar23 <= iVar30) {
                  iVar23 = iVar30;
                }
                lVar25 = (long)iVar23 - (long)iVar30;
                auVar32._8_4_ = (int)lVar25;
                auVar32._0_8_ = lVar25;
                auVar32._12_4_ = (int)((ulong)lVar25 >> 0x20);
                puVar21 = (uint32_t *)
                          ((long)&local_a0[iVar30].flag +
                          ((local_b0 + lVar29) * local_c0 + local_a8 + lVar26 * 4) * local_b8);
                auVar32 = auVar32 ^ auVar14;
                do {
                  lVar28 = lVar26;
                  puVar31 = puVar21;
                  if (iVar6 <= iVar2) {
                    do {
                      if (iVar5 <= iVar4) {
                        uVar18 = 0;
                        do {
                          auVar33._8_4_ = (int)uVar18;
                          auVar33._0_8_ = uVar18;
                          auVar33._12_4_ = (int)(uVar18 >> 0x20);
                          auVar34 = (auVar33 | auVar13) ^ auVar14;
                          iVar24 = auVar32._4_4_;
                          if ((bool)(~(iVar24 < auVar34._4_4_ ||
                                      auVar32._0_4_ < auVar34._0_4_ && auVar34._4_4_ == iVar24) & 1)
                             ) {
                            puVar31[uVar18 - 3] = 0x40003;
                          }
                          if (auVar34._12_4_ <= auVar32._12_4_ &&
                              (auVar34._8_4_ <= auVar32._8_4_ || auVar34._12_4_ != auVar32._12_4_))
                          {
                            puVar31[uVar18 - 2] = 0x40003;
                          }
                          auVar33 = (auVar33 | auVar15) ^ auVar14;
                          iVar23 = auVar33._4_4_;
                          if (iVar23 <= iVar24 &&
                              (iVar23 != iVar24 || auVar33._0_4_ <= auVar32._0_4_)) {
                            puVar31[uVar18 - 1] = 0x40003;
                            puVar31[uVar18] = 0x40003;
                          }
                          uVar18 = uVar18 + 4;
                        } while ((lVar25 + 4U & 0xfffffffffffffffc) != uVar18);
                      }
                      puVar31 = puVar31 + lVar20;
                      bVar9 = lVar28 < iVar2 - iVar3;
                      lVar28 = lVar28 + 1;
                    } while (bVar9);
                  }
                  puVar21 = (uint32_t *)((long)puVar21 + lVar22);
                  bVar9 = lVar29 < iVar1 - iVar7;
                  lVar29 = lVar29 + 1;
                } while (bVar9);
              }
            }
            pIVar27 = pIVar27 + 1;
            bx_in = local_d0;
          } while (pIVar27 != local_c8);
        }
        *(undefined4 *)&(this_00->super_BaseFab<amrex::EBCellFlag>).field_0x44 = 100;
        FVar17 = EBCellFlagFab::getType(this_00,bx_in);
        *(FabType *)&(this_00->super_BaseFab<amrex::EBCellFlag>).field_0x44 = FVar17;
        if (1 < iVar16) {
          iVar24 = 1;
          do {
            uVar10 = *(undefined8 *)(bx_in->smallend).vect;
            uVar11 = *(undefined8 *)((bx_in->smallend).vect + 2);
            uVar12 = *(undefined8 *)((bx_in->bigend).vect + 2);
            r.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx_in->bigend).vect >> 0x20);
            r.bigend.vect[2] = (int)uVar12;
            r.btype.itype = (uint)((ulong)uVar12 >> 0x20);
            r.smallend.vect[2] = (int)uVar11;
            r.bigend.vect[0] = (int)((ulong)uVar11 >> 0x20);
            r.smallend.vect[0] = (int)uVar10;
            r.smallend.vect[1] = (int)((ulong)uVar10 >> 0x20);
            r.smallend.vect[2] = r.smallend.vect[2] + iVar24;
            r.bigend.vect[0] = r.bigend.vect[0] - iVar24;
            r.smallend.vect[1] = r.smallend.vect[1] + iVar24;
            r.smallend.vect[0] = r.smallend.vect[0] + iVar24;
            r.bigend.vect[1] = r.bigend.vect[1] - iVar24;
            r.bigend.vect[2] = r.bigend.vect[2] - iVar24;
            EBCellFlagFab::getType(this_00,&r);
            iVar24 = iVar24 + 1;
          } while (iVar16 != iVar24);
        }
        MFIter::operator++(&mfi);
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
    if (isects.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(isects.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)isects.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)isects.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f8.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
Level::fillEBCellFlag (FabArray<EBCellFlagFab>& cellflag, const Geometry& geom) const
{
    if (isAllRegular()) {
        cellflag.setVal(EBCellFlag::TheDefaultCell());
        for (MFIter mfi(cellflag); mfi.isValid(); ++mfi)
        {
            auto& fab = cellflag[mfi];
            fab.setType(FabType::regular);
        }
        return;
    }

    const int ng = cellflag.nGrow();

    cellflag.ParallelCopy(m_cellflag,0,0,1,0,ng,geom.periodicity());

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

    auto cov_val = EBCellFlag::TheCoveredCell();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(cellflag,MFItInfo().UseDefaultStream()); mfi.isValid(); ++mfi)
        {
            auto& fab = cellflag[mfi];
            auto const& a = fab.array();
            const Box& bx = fab.box();
            if (!m_covered_grids.empty())
            {
                for (const auto& iv : pshifts)
                {
                    m_covered_grids.intersections(bx+iv, isects);
                    for (const auto& is : isects) {
                        Box const& ibox = is.second-iv;
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(ibox, i, j, k,
                        {
                            a(i,j,k) = cov_val;
                        });
                    }
                }
            }

            // fix type for each fab
            fab.setType(FabType::undefined);
            auto typ = fab.getType(bx);
            fab.setType(typ);
            for (int nshrink = 1; nshrink < ng; ++nshrink) {
                const Box& b = amrex::grow(bx,-nshrink);
                fab.getType(b);
            }
        }
    }
}